

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_378;
  MessageBuilder local_370;
  uint local_1ec;
  uint local_1e8;
  int uniform_count;
  int uniform_location;
  _uniform_function function;
  uint n_check;
  uint n_checks;
  int data [72];
  bool local_a9;
  bool result;
  Functions *gl;
  undefined1 local_98 [4];
  GLenum error_code;
  double double_data [16];
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  memcpy(local_98,&DAT_029eeb60,0x80);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_a9 = true;
  n_check = 2;
  n_checks = this->m_po_double_uniform_location;
  data[0] = 0;
  data[1] = 3;
  data[2] = this->m_po_double_uniform_location;
  data[3] = 2;
  data[4] = 4;
  data[5] = this->m_po_double_uniform_location;
  data[6] = 0;
  data[7] = 5;
  data[8] = this->m_po_double_uniform_location;
  data[9] = 2;
  data[10] = 6;
  data[0xb] = this->m_po_double_uniform_location;
  data[0xc] = 0;
  data[0xd] = 7;
  data[0xe] = this->m_po_double_uniform_location;
  data[0xf] = 2;
  data[0x10] = 0;
  data[0x11] = this->m_po_dvec2_uniform_location;
  data[0x12] = 0;
  data[0x13] = 1;
  data[0x14] = this->m_po_dvec2_uniform_location;
  data[0x15] = 2;
  data[0x16] = 4;
  data[0x17] = this->m_po_dvec2_uniform_location;
  data[0x18] = 0;
  data[0x19] = 5;
  data[0x1a] = this->m_po_dvec2_uniform_location;
  data[0x1b] = 2;
  data[0x1c] = 6;
  data[0x1d] = this->m_po_dvec2_uniform_location;
  data[0x1e] = 0;
  data[0x1f] = 7;
  data[0x20] = this->m_po_dvec2_uniform_location;
  data[0x21] = 2;
  data[0x22] = 0;
  data[0x23] = this->m_po_dvec3_uniform_location;
  data[0x24] = 0;
  data[0x25] = 1;
  data[0x26] = this->m_po_dvec3_uniform_location;
  data[0x27] = 2;
  data[0x28] = 2;
  data[0x29] = this->m_po_dvec3_uniform_location;
  data[0x2a] = 0;
  data[0x2b] = 3;
  data[0x2c] = this->m_po_dvec3_uniform_location;
  data[0x2d] = 2;
  data[0x2e] = 6;
  data[0x2f] = this->m_po_dvec3_uniform_location;
  data[0x30] = 0;
  data[0x31] = 7;
  data[0x32] = this->m_po_dvec3_uniform_location;
  data[0x33] = 2;
  data[0x34] = 0;
  data[0x35] = this->m_po_dvec4_uniform_location;
  data[0x36] = 0;
  data[0x37] = 1;
  data[0x38] = this->m_po_dvec4_uniform_location;
  data[0x39] = 2;
  data[0x3a] = 2;
  data[0x3b] = this->m_po_dvec4_uniform_location;
  data[0x3c] = 0;
  data[0x3d] = 3;
  data[0x3e] = this->m_po_dvec4_uniform_location;
  data[0x3f] = 2;
  data[0x40] = 4;
  data[0x41] = this->m_po_dvec4_uniform_location;
  data[0x42] = 0;
  data[0x43] = 5;
  data[0x44] = this->m_po_dvec4_uniform_location;
  data[0x45] = 2;
  function = UNIFORM_FUNCTION_MATRIX4X3DV|UNIFORM_FUNCTION_MATRIX2DV;
  (**(code **)(lVar3 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xba5);
  for (uniform_location = 0; (uint)uniform_location < 0x18; uniform_location = uniform_location + 1)
  {
    uniform_count = (&n_check)[(uint)(uniform_location * 3)];
    local_1e8 = (&n_check)[uniform_location * 3 + 1];
    local_1ec = (&n_check)[uniform_location * 3 + 2];
    switch(uniform_count) {
    case 0:
      (**(code **)(lVar3 + 0x14d0))(0,local_1e8);
      break;
    case 1:
      (**(code **)(lVar3 + 0x14d8))(local_1e8,local_1ec,local_98);
      break;
    case 2:
      (**(code **)(lVar3 + 0x1510))(0,0x3ff0000000000000,local_1e8);
      break;
    case 3:
      (**(code **)(lVar3 + 0x1518))(local_1e8,local_1ec,local_98);
      break;
    case 4:
      (**(code **)(lVar3 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000,local_1e8);
      break;
    case 5:
      (**(code **)(lVar3 + 0x1558))(local_1e8,local_1ec,local_98);
      break;
    case 6:
      (**(code **)(lVar3 + 0x1590))
                (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,local_1e8);
      break;
    case 7:
      (**(code **)(lVar3 + 0x1598))(local_1e8,local_1ec,local_98);
    }
    iVar1 = (**(code **)(lVar3 + 0x800))();
    if (iVar1 != 0x502) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_370,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      local_378 = getUniformFunctionString(this,uniform_count);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_370,&local_378);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [119])
                                 "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible size. (check index: "
                         );
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&uniform_location);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_370);
      local_a9 = false;
    }
  }
  return local_a9;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const int data[] = {
		/* API function */ /* Uniform location */ /* Count (dv functions only) */
		(int)UNIFORM_FUNCTION_2D, m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_2DV,
		m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_double_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_double_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_dvec2_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec2_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec3_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec3_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec4_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_3D,
		m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_3DV, m_po_dvec4_uniform_location, 2,
	};
	const unsigned int n_checks = sizeof(data) / sizeof(data[0]) / 3 /* entries per row */;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_check = 0; n_check < n_checks; ++n_check)
	{
		_uniform_function function		   = (_uniform_function)data[n_check * 3 + 0];
		int				  uniform_location = data[n_check * 3 + 1];
		int				  uniform_count	= data[n_check * 3 + 2];

		switch (function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(uniform_location, uniform_count, double_data);
			break;

		default:
		{
			DE_ASSERT(false);
		}
		} /* switch (function) */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << getUniformFunctionString(function)
							   << "() function did not generate GL_INVALID_OPERATION error when called for"
								  " a uniform of incompatible size. (check index: "
							   << n_check << ")" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all checks) */

	return result;
}